

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  void **ppvVar1;
  _Bool connected;
  curl_chunk_end_callback p_Var2;
  curl_llist *pcVar3;
  Curl_easy *pCVar4;
  curl_chunk_bgn_callback p_Var5;
  CURLcode CVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  undefined8 *puVar10;
  ftp_parselist_data *pfVar11;
  curl_wildcard_states cVar12;
  curl_wildcard_states cVar13;
  Curl_easy *pCVar14;
  CURLcode local_3c;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pCVar14 = conn->data;
  if ((pCVar14->set).wildcardmatch == true) {
    cVar13 = CURLWC_CLEAN;
    do {
      switch((pCVar14->wildcard).state) {
      case CURLWC_INIT:
        goto switchD_00112fdf_caseD_0;
      case CURLWC_MATCHING:
        puVar10 = (undefined8 *)(pCVar14->wildcard).tmp;
        (pCVar14->set).fwrite_func = (curl_write_callback)puVar10[1];
        (pCVar14->set).out = (void *)puVar10[2];
        puVar10[1] = 0;
        puVar10[2] = 0;
        (pCVar14->wildcard).state = CURLWC_DOWNLOADING;
        CVar6 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar10);
        cVar12 = cVar13;
        if (CVar6 != CURLE_OK) break;
        if (((pCVar14->wildcard).filelist)->size != 0) goto LAB_00113167;
        CVar6 = CURLE_REMOTE_FILE_NOT_FOUND;
        goto LAB_001133dc;
      case CURLWC_DOWNLOADING:
        puVar10 = (undefined8 *)((pCVar14->wildcard).filelist)->head->ptr;
        pcVar7 = curl_maprintf("%s%s",(pCVar14->wildcard).path,*puVar10);
        local_3c = CURLE_OUT_OF_MEMORY;
        if (pcVar7 == (char *)0x0) goto LAB_001133e7;
        (*Curl_cfree)((conn->data->state).pathbuffer);
        pCVar4 = conn->data;
        (pCVar4->state).pathbuffer = pcVar7;
        (pCVar4->state).path = pcVar7;
        Curl_infof(pCVar4,"Wildcard - START of \"%s\"\n",*puVar10);
        p_Var5 = (conn->data->set).chunk_bgn;
        if (p_Var5 != (curl_chunk_bgn_callback)0x0) {
          lVar8 = (*p_Var5)(puVar10,(pCVar14->wildcard).customptr,
                            (int)((pCVar14->wildcard).filelist)->size);
          if (lVar8 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar10);
            cVar12 = CURLWC_SKIP;
            break;
          }
          if (lVar8 == 1) {
            local_3c = CURLE_CHUNK_FAILED;
            goto LAB_001133e7;
          }
        }
        cVar12 = CURLWC_SKIP;
        if (*(int *)(puVar10 + 1) == 0) {
          if ((*(byte *)(puVar10 + 0xc) & 0x40) != 0) {
            (conn->proto).ftpc.known_filesize = puVar10[5];
          }
          local_3c = ftp_parse_url_path(conn);
          if (local_3c != CURLE_OK) goto LAB_001133e7;
          pcVar3 = (pCVar14->wildcard).filelist;
          Curl_llist_remove(pcVar3,pcVar3->head,(void *)0x0);
          CVar6 = CURLE_OK;
          local_3c = CURLE_OK;
          if (((pCVar14->wildcard).filelist)->size != 0) goto LAB_001133e7;
          goto LAB_001133dc;
        }
        break;
      case CURLWC_CLEAN:
        puVar10 = (undefined8 *)(pCVar14->wildcard).tmp;
        if (puVar10 == (undefined8 *)0x0) {
          CVar6 = CURLE_OK;
          cVar13 = CURLWC_DONE;
        }
        else {
          CVar6 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar10);
          cVar13 = (CVar6 == CURLE_OK) + CURLWC_ERROR;
        }
        goto LAB_001133dc;
      case CURLWC_SKIP:
        p_Var2 = (pCVar14->set).chunk_end;
        if (p_Var2 != (curl_chunk_end_callback)0x0) {
          (*p_Var2)((pCVar14->wildcard).customptr);
        }
        pcVar3 = (pCVar14->wildcard).filelist;
        Curl_llist_remove(pcVar3,pcVar3->head,(void *)0x0);
        cVar12 = (((pCVar14->wildcard).filelist)->size == 0) + CURLWC_DOWNLOADING;
        break;
      default:
        local_3c = CURLE_OK;
        goto LAB_001133e7;
      }
      (pCVar14->wildcard).state = cVar12;
LAB_00113167:
      pCVar14 = conn->data;
    } while( true );
  }
  CVar6 = ftp_parse_url_path(conn);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  pCVar14 = conn->data;
  goto LAB_0011340b;
switchD_00112fdf_caseD_0:
  pcVar7 = (pCVar14->state).path;
  pcVar9 = strrchr(pcVar7,0x2f);
  if (pcVar9 != (char *)0x0) {
    if (pcVar9[1] != '\0') {
      pcVar7 = pcVar9 + 1;
      pcVar9 = (*Curl_cstrdup)(pcVar7);
      (pCVar14->wildcard).pattern = pcVar9;
      goto LAB_00113294;
    }
LAB_00113345:
    (pCVar14->wildcard).state = CURLWC_CLEAN;
    CVar6 = ftp_parse_url_path(conn);
    goto LAB_001133bd;
  }
  if (*pcVar7 == '\0') goto LAB_00113345;
  pcVar9 = (*Curl_cstrdup)(pcVar7);
  (pCVar14->wildcard).pattern = pcVar9;
LAB_00113294:
  if (pcVar9 == (char *)0x0) {
LAB_001133ba:
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *pcVar7 = '\0';
    puVar10 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    if (puVar10 == (undefined8 *)0x0) {
      (*Curl_cfree)((pCVar14->wildcard).pattern);
      (pCVar14->wildcard).pattern = (char *)0x0;
      goto LAB_001133ba;
    }
    pfVar11 = Curl_ftp_parselist_data_alloc();
    *puVar10 = pfVar11;
    if (pfVar11 == (ftp_parselist_data *)0x0) {
      (*Curl_cfree)((pCVar14->wildcard).pattern);
      (pCVar14->wildcard).pattern = (char *)0x0;
      (*Curl_cfree)(puVar10);
      goto LAB_001133ba;
    }
    (pCVar14->wildcard).tmp = puVar10;
    (pCVar14->wildcard).tmp_dtor = wc_data_dtor;
    if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
      (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
    }
    ppvVar1 = &(pCVar14->wildcard).tmp;
    CVar6 = ftp_parse_url_path(conn);
    if (CVar6 == CURLE_OK) {
      pcVar7 = (*Curl_cstrdup)((conn->data->state).path);
      (pCVar14->wildcard).path = pcVar7;
      if (pcVar7 == (char *)0x0) {
        (*Curl_cfree)((pCVar14->wildcard).pattern);
        (pCVar14->wildcard).pattern = (char *)0x0;
        (*(pCVar14->wildcard).tmp_dtor)((pCVar14->wildcard).tmp);
        *ppvVar1 = (void *)0x0;
        (pCVar14->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
        goto LAB_001133ba;
      }
      pCVar4 = conn->data;
      puVar10[1] = (pCVar4->set).fwrite_func;
      (pCVar4->set).fwrite_func = Curl_ftp_parselist;
      puVar10[2] = (pCVar4->set).out;
      (pCVar4->set).out = conn;
      Curl_infof(pCVar4,"Wildcard - Parsing started\n");
      CVar6 = CURLE_OK;
    }
    else {
      (*Curl_cfree)((pCVar14->wildcard).pattern);
      (pCVar14->wildcard).pattern = (char *)0x0;
      (*(pCVar14->wildcard).tmp_dtor)((pCVar14->wildcard).tmp);
      *ppvVar1 = (void *)0x0;
      (pCVar14->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
    }
  }
LAB_001133bd:
  local_3c = CVar6;
  if ((pCVar14->wildcard).state != CURLWC_CLEAN) {
    cVar13 = (uint)(CVar6 != CURLE_OK) * 4 + CURLWC_MATCHING;
LAB_001133dc:
    (pCVar14->wildcard).state = cVar13;
    local_3c = CVar6;
  }
LAB_001133e7:
  pCVar14 = conn->data;
  if (((pCVar14->wildcard).state | CURLWC_DOWNLOADING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (local_3c != CURLE_OK) {
    return local_3c;
  }
LAB_0011340b:
  (pCVar14->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar14,0);
  Curl_pgrsSetDownloadCounter(pCVar14,0);
  Curl_pgrsSetUploadSize(pCVar14,-1);
  Curl_pgrsSetDownloadSize(pCVar14,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x18) = 1;
  }
  *done = false;
  CVar6 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar6 == CURLE_OK) {
    CVar6 = ftp_multi_statemach(conn,done);
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar6 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar6 = ftp_dophase_done(conn,connected);
      return CVar6;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar6;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->set.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}